

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O1

void __thiscall OmegaOP::algo(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  pointer pdVar1;
  pointer pdVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  uint local_78;
  Costs cost;
  uint local_70;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  double local_40;
  double local_38;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = (ulong)this->nbStates;
  Costs::Costs(&cost);
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  uVar8 = (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1;
  local_50 = (ulong)uVar8;
  local_78 = 2;
  if (2 < uVar8) {
    local_48 = local_68 * 8;
    do {
      if (local_68 != 0) {
        local_58 = 0;
        do {
          local_70 = 1;
          local_6c = 0;
          local_38 = INFINITY;
          local_60 = 0;
          if (1 < local_78) {
            local_60 = 0;
            local_6c = 0;
            local_38 = INFINITY;
            do {
              uVar6 = 0;
              lVar7 = 0;
              do {
                uVar4 = (ulong)local_70;
                local_40 = *(double *)(*(long *)((long)this->Q + lVar7) + uVar4 * 8);
                ppdVar3 = this->S12P;
                uVar5 = (ulong)local_78;
                dVar9 = Costs::slopeCost(&cost,(double *)((long)this->states + lVar7),
                                         this->states + local_58,&local_70,&local_78,
                                         *ppdVar3 + uVar4,*ppdVar3 + uVar5,ppdVar3[1] + uVar4,
                                         ppdVar3[1] + uVar5,ppdVar3[2] + uVar4,ppdVar3[2] + uVar5);
                dVar9 = dVar9 + local_40 + this->penalty;
                if (dVar9 < local_38) {
                  local_6c = local_70;
                  local_38 = dVar9;
                  local_60 = uVar6;
                }
                lVar7 = lVar7 + 8;
                uVar6 = (ulong)((int)uVar6 + 1);
              } while (local_48 != lVar7);
              local_70 = local_70 + 1;
            } while (local_70 < local_78);
          }
          this->Q[local_58][local_78] = local_38;
          this->lastChpt[local_58][local_78] = local_6c;
          this->lastIndState[local_58][local_78] = (uint)local_60;
          local_58 = local_58 + 1;
        } while (local_58 != local_68);
      }
      local_78 = local_78 + 1;
    } while (local_78 < (uint)local_50);
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaOP::algo(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }

      }
      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }
  pruning = 1;

}